

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 2_variable_reference.cpp
# Opt level: O0

dota_record * accumulate(dota_record *target,dota_record *source)

{
  dota_record *source_local;
  dota_record *target_local;
  
  target->played = source->played + target->played;
  target->win = source->win + target->win;
  update_record(target);
  return target;
}

Assistant:

dota_record & accumulate(dota_record & target, const dota_record & source) {
    //  first param is not const, so we can modify it.
    target.played += source.played;
    target.win += source.win;
    update_record(target);
    return target;
}